

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircleWidget.cpp
# Opt level: O3

void __thiscall CircleWidget::paintEvent(CircleWidget *this,QPaintEvent *event)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QPainter painter;
  QRect QStack_38;
  undefined8 local_28;
  
  iVar4 = *(int *)(*(long *)&this->field_0x20 + 0x1c);
  iVar3 = *(int *)(*(long *)&this->field_0x20 + 0x14);
  iVar2 = QPen::width();
  iVar4 = ((iVar4 - iVar3) + 1) / 6 + iVar2 / 2;
  iVar3 = *(int *)(*(long *)&this->field_0x20 + 0x1c) - *(int *)(*(long *)&this->field_0x20 + 0x14);
  if ((iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1 <= iVar4) {
    iVar4 = iVar2 / 2;
  }
  QPainter::QPainter((QPainter *)&QStack_38,(QPaintDevice *)&this->field_0x10);
  QPainter::setRenderHint((RenderHint)&QStack_38,true);
  QPainter::setPen((QPen *)&QStack_38);
  QPainter::setBrush((QBrush *)&QStack_38);
  lVar1 = *(long *)&this->field_0x20;
  QStack_38.y2 = iVar4;
  QStack_38.x2 = iVar4;
  local_28 = CONCAT44(*(int *)(lVar1 + 0x20) - (iVar4 + *(int *)(lVar1 + 0x18)),
                      *(int *)(lVar1 + 0x1c) - (*(int *)(lVar1 + 0x14) + iVar4));
  QPainter::drawEllipse(&QStack_38);
  QPainter::~QPainter((QPainter *)&QStack_38);
  return;
}

Assistant:

void CircleWidget::paintEvent(QPaintEvent *event) {
    int margin = width() / 6;

    // pen.width() / 2 because when painting a shape with an outline, we have to factor in the width of the pen
    int offset = pen.width() / 2 + margin;

    if (offset >= width() / 2)
        offset -= margin;

    QPainter painter(this);
    painter.setRenderHint(QPainter::Antialiasing);
    painter.setPen(pen);
    painter.setBrush(brush);
    painter.drawEllipse(rect().adjusted(offset, offset, -offset, -offset));
}